

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLTest_CipherRules_Test::TestBody(SSLTest_CipherRules_Test *this)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  SSL_METHOD *pSVar4;
  OPENSSL_STACK *pOVar5;
  size_t sVar6;
  SSL_CIPHER *pSVar7;
  SSL_CTX *ctx_00;
  SSL_CTX *ctx_01;
  pointer *__ptr;
  size_t sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ScopedTrace *this_01;
  char *pcVar9;
  char *in_R9;
  long lVar10;
  UniquePtr<SSL_CTX> ctx;
  ScopedTrace gtest_trace_574;
  UniquePtr<SSL_CTX> ctx_1;
  ScopedTrace gtest_trace_596;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  ScopedTrace local_51;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  AssertHelper local_40;
  long local_38;
  
  lVar10 = 0;
  do {
    testing::ScopedTrace::ScopedTrace
              (&local_51,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x23e,*(char **)((long)&(anonymous_namespace)::kCipherTests + lVar10));
    pSVar4 = (SSL_METHOD *)TLS_method();
    local_a0._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(pSVar4);
    local_78[0] = local_a0._M_head_impl != (SSL_CTX *)0x0;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_a0._M_head_impl == (SSL_CTX *)0x0) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,(AssertionResult *)0x336329,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x240,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_50);
LAB_0015d579:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if ((SSL_CTX *)local_50._M_head_impl != (SSL_CTX *)0x0) {
        (**(code **)(*(long *)local_50._M_head_impl + 8))();
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
      std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_a0);
      this_01 = &local_51;
      goto LAB_0015d73e;
    }
    iVar3 = SSL_CTX_set_cipher_list
                      ((SSL_CTX *)local_a0._M_head_impl,
                       *(char **)((long)&(anonymous_namespace)::kCipherTests + lVar10));
    local_78[0] = iVar3 != 0;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,
                 (AssertionResult *)"SSL_CTX_set_cipher_list(ctx.get(), t.rule)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x243,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_50);
      goto LAB_0015d579;
    }
    bVar1 = CipherListsEqual(local_a0._M_head_impl,
                             (vector<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                              *)(&DAT_00442958 + lVar10));
    local_50._M_head_impl._0_1_ = bVar1;
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&local_a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_a8._M_head_impl + 0x10),"Cipher rule evaluated to:\n",0x1a);
      (anonymous_namespace)::CipherListToString_abi_cxx11_
                ((string *)local_98,(_anonymous_namespace_ *)local_a0._M_head_impl,ctx_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_a8._M_head_impl + 0x10),
                 (char *)CONCAT71(local_98._1_7_,local_98[0]),(long)local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_78,(internal *)&local_50,
                 (AssertionResult *)"CipherListsEqual(ctx.get(), t.expected)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x244,(char *)CONCAT44(local_78._4_4_,local_78._0_4_));
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._4_4_,local_78._0_4_) != &local_68) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_78._4_4_,local_78._0_4_),
                        local_68._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_a8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_a8._M_head_impl + 8))();
      }
      if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_48,local_48);
      }
    }
    if ((&DAT_00442970)[lVar10] == '\x01') {
      iVar3 = SSL_CTX_set_strict_cipher_list
                        (local_a0._M_head_impl,
                         *(char **)((long)&(anonymous_namespace)::kCipherTests + lVar10));
      local_78[0] = iVar3 == 0;
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 != 0) {
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_98,(internal *)local_78,
                   (AssertionResult *)"SSL_CTX_set_strict_cipher_list(ctx.get(), t.rule)","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x24a,(char *)CONCAT71(local_98._1_7_,local_98[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1
                         );
        }
        if ((SSL_CTX *)local_50._M_head_impl != (SSL_CTX *)0x0) {
          (**(code **)(*(long *)local_50._M_head_impl + 8))();
        }
        if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_70;
          __ptr_00 = local_70;
LAB_0015cf42:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(this_00,__ptr_00);
        }
      }
    }
    else {
      iVar3 = SSL_CTX_set_strict_cipher_list
                        (local_a0._M_head_impl,
                         *(char **)((long)&(anonymous_namespace)::kCipherTests + lVar10));
      local_78[0] = iVar3 != 0;
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_98,(internal *)local_78,
                   (AssertionResult *)"SSL_CTX_set_strict_cipher_list(ctx.get(), t.rule)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x24c,(char *)CONCAT71(local_98._1_7_,local_98[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_50);
        goto LAB_0015d579;
      }
      bVar1 = CipherListsEqual(local_a0._M_head_impl,
                               (vector<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                                *)(&DAT_00442958 + lVar10));
      local_50._M_head_impl._0_1_ = bVar1;
      local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar1) {
        testing::Message::Message((Message *)&local_a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_a8._M_head_impl + 0x10),"Cipher rule evaluated to:\n",0x1a);
        (anonymous_namespace)::CipherListToString_abi_cxx11_
                  ((string *)local_98,(_anonymous_namespace_ *)local_a0._M_head_impl,ctx_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_a8._M_head_impl + 0x10),
                   (char *)CONCAT71(local_98._1_7_,local_98[0]),(long)local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_78,(internal *)&local_50,
                   (AssertionResult *)"CipherListsEqual(ctx.get(), t.expected)","false","true",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x24d,(char *)CONCAT44(local_78._4_4_,local_78._0_4_));
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._4_4_,local_78._0_4_) != &local_68) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_78._4_4_,local_78._0_4_),
                          local_68._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1
                         );
        }
        if (local_a8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_a8._M_head_impl + 8))();
        }
        if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_48;
          __ptr_00 = local_48;
          goto LAB_0015cf42;
        }
      }
    }
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_a0);
    testing::ScopedTrace::~ScopedTrace(&local_51);
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 1000);
  lVar10 = 0;
  do {
    pcVar9 = *(char **)((long)&(anonymous_namespace)::kBadRules + lVar10);
    testing::ScopedTrace::ScopedTrace
              ((ScopedTrace *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x254,pcVar9);
    pSVar4 = (SSL_METHOD *)TLS_method();
    local_50._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         SSL_CTX_new(pSVar4);
    local_78[0] = (SSL_CTX *)local_50._M_head_impl != (SSL_CTX *)0x0;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((SSL_CTX *)local_50._M_head_impl == (SSL_CTX *)0x0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,(AssertionResult *)0x336329,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x256,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_a0);
      goto LAB_0015d6e7;
    }
    iVar3 = SSL_CTX_set_cipher_list((SSL_CTX *)local_50._M_head_impl,pcVar9);
    local_78[0] = iVar3 == 0;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 != 0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,
                 (AssertionResult *)"SSL_CTX_set_cipher_list(ctx.get(), rule)","true","false",in_R9)
      ;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,600,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_a0._M_head_impl != (SSL_CTX *)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
    }
    ERR_clear_error();
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_50);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_40);
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x78);
  lVar10 = 0;
  do {
    pcVar9 = *(char **)((long)&(anonymous_namespace)::kMustNotIncludeDeprecated + lVar10);
    local_38 = lVar10;
    testing::ScopedTrace::ScopedTrace
              ((ScopedTrace *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x25d,pcVar9);
    pSVar4 = (SSL_METHOD *)TLS_method();
    local_50._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         SSL_CTX_new(pSVar4);
    local_78[0] = (SSL_CTX *)local_50._M_head_impl != (SSL_CTX *)0x0;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((SSL_CTX *)local_50._M_head_impl == (SSL_CTX *)0x0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,(AssertionResult *)0x336329,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x25f,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_a0);
      goto LAB_0015d6e7;
    }
    iVar3 = SSL_CTX_set_strict_cipher_list((SSL_CTX *)local_50._M_head_impl,pcVar9);
    local_78[0] = iVar3 != 0;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,
                 (AssertionResult *)"SSL_CTX_set_strict_cipher_list(ctx.get(), rule)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x261,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_a0);
LAB_0015d6e7:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_a0._M_head_impl != (SSL_CTX *)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
      std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_50);
      this_01 = (ScopedTrace *)&local_40;
LAB_0015d73e:
      testing::ScopedTrace::~ScopedTrace(this_01);
      return;
    }
    pOVar5 = (OPENSSL_STACK *)SSL_CTX_get_ciphers((SSL_CTX *)local_50._M_head_impl);
    sVar6 = OPENSSL_sk_num(pOVar5);
    if (sVar6 != 0) {
      sVar8 = 0;
      do {
        pSVar7 = (SSL_CIPHER *)OPENSSL_sk_value(pOVar5,sVar8);
        local_78._0_4_ = 0;
        iVar3 = SSL_CIPHER_get_cipher_nid(pSVar7);
        local_a0._M_head_impl._0_4_ = iVar3;
        testing::internal::CmpHelperNE<int,int>
                  ((internal *)local_98,"0","SSL_CIPHER_get_cipher_nid(cipher)",(int *)local_78,
                   (int *)&local_a0);
        if (local_98[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_78);
          pcVar9 = "";
          if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar9 = (local_90->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x263,pcVar9);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)local_78);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
          if ((long *)CONCAT44(local_78._4_4_,local_78._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_78._4_4_,local_78._0_4_) + 8))();
          }
        }
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_90,local_90);
        }
        bVar1 = ssl_cipher_is_deprecated(pSVar7);
        local_78[0] = !bVar1;
        local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar1) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_98,(internal *)local_78,
                     (AssertionResult *)"ssl_cipher_is_deprecated(cipher)","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x264,(char *)CONCAT71(local_98._1_7_,local_98[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_a0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_98._1_7_,local_98[0]),
                            local_88._M_allocated_capacity + 1);
          }
          if (local_a0._M_head_impl != (SSL_CTX *)0x0) {
            (**(code **)(*(long *)local_a0._M_head_impl + 8))();
          }
          if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_70,local_70);
          }
        }
        sVar8 = sVar8 + 1;
      } while (sVar6 != sVar8);
    }
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_50);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_40);
    lVar10 = local_38 + 8;
  } while (lVar10 != 0x50);
  lVar10 = 0;
  do {
    pcVar9 = *(char **)((long)&(anonymous_namespace)::kShouldIncludeCBCSHA256 + lVar10);
    pSVar4 = (SSL_METHOD *)TLS_method();
    local_50._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         SSL_CTX_new(pSVar4);
    local_78[0] = (SSL_CTX *)local_50._M_head_impl != (SSL_CTX *)0x0;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((SSL_CTX *)local_50._M_head_impl == (SSL_CTX *)0x0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,(AssertionResult *)0x336329,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x26b,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_a0);
LAB_0015d806:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_a0._M_head_impl != (SSL_CTX *)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
      std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_50);
      return;
    }
    iVar3 = SSL_CTX_set_strict_cipher_list((SSL_CTX *)local_50._M_head_impl,pcVar9);
    local_78[0] = iVar3 != 0;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,
                 (AssertionResult *)"SSL_CTX_set_strict_cipher_list(ctx.get(), rule)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x26c,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_a0);
      goto LAB_0015d806;
    }
    pOVar5 = (OPENSSL_STACK *)SSL_CTX_get_ciphers((SSL_CTX *)local_50._M_head_impl);
    sVar6 = OPENSSL_sk_num(pOVar5);
    if (sVar6 != 0) {
      sVar8 = 0;
      do {
        pSVar7 = (SSL_CIPHER *)OPENSSL_sk_value(pOVar5,sVar8);
        uVar2 = SSL_CIPHER_get_protocol_id(pSVar7);
        if (uVar2 == 0xc027) goto LAB_0015d44a;
        sVar8 = sVar8 + 1;
      } while (sVar6 != sVar8);
    }
    local_78._0_4_ = local_78._0_4_ & 0xffffff00;
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)local_78,(AssertionResult *)"found","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x276,(char *)CONCAT71(local_98._1_7_,local_98[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
    }
    if (local_a0._M_head_impl != (SSL_CTX *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
LAB_0015d44a:
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_50);
    lVar10 = lVar10 + 8;
    if (lVar10 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

TEST(SSLTest, CipherRules) {
  for (const CipherTest &t : kCipherTests) {
    SCOPED_TRACE(t.rule);
    bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
    ASSERT_TRUE(ctx);

    // Test lax mode.
    ASSERT_TRUE(SSL_CTX_set_cipher_list(ctx.get(), t.rule));
    EXPECT_TRUE(CipherListsEqual(ctx.get(), t.expected))
        << "Cipher rule evaluated to:\n"
        << CipherListToString(ctx.get());

    // Test strict mode.
    if (t.strict_fail) {
      EXPECT_FALSE(SSL_CTX_set_strict_cipher_list(ctx.get(), t.rule));
    } else {
      ASSERT_TRUE(SSL_CTX_set_strict_cipher_list(ctx.get(), t.rule));
      EXPECT_TRUE(CipherListsEqual(ctx.get(), t.expected))
          << "Cipher rule evaluated to:\n"
          << CipherListToString(ctx.get());
    }
  }

  for (const char *rule : kBadRules) {
    SCOPED_TRACE(rule);
    bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
    ASSERT_TRUE(ctx);

    EXPECT_FALSE(SSL_CTX_set_cipher_list(ctx.get(), rule));
    ERR_clear_error();
  }

  for (const char *rule : kMustNotIncludeDeprecated) {
    SCOPED_TRACE(rule);
    bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
    ASSERT_TRUE(ctx);

    ASSERT_TRUE(SSL_CTX_set_strict_cipher_list(ctx.get(), rule));
    for (const SSL_CIPHER *cipher : SSL_CTX_get_ciphers(ctx.get())) {
      EXPECT_NE(NID_undef, SSL_CIPHER_get_cipher_nid(cipher));
      EXPECT_FALSE(ssl_cipher_is_deprecated(cipher));
    }
  }

  {
    for (const char *rule : kShouldIncludeCBCSHA256) {
      bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
      ASSERT_TRUE(ctx);
      ASSERT_TRUE(SSL_CTX_set_strict_cipher_list(ctx.get(), rule));

      bool found = false;
      for (const SSL_CIPHER *cipher : SSL_CTX_get_ciphers(ctx.get())) {
        if ((TLS1_CK_ECDHE_RSA_WITH_AES_128_CBC_SHA256 & 0xffff) ==
            SSL_CIPHER_get_protocol_id(cipher)) {
          found = true;
          break;
        }
      }
      EXPECT_TRUE(found);
    }
  }
}